

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O3

void __thiscall
kj::_::ExceptionOr<capnp::AnyPointer::Pipeline>::~ExceptionOr
          (ExceptionOr<capnp::AnyPointer::Pipeline> *this)

{
  PipelineOp *pPVar1;
  size_t sVar2;
  ArrayDisposer *pAVar3;
  PipelineHook *pPVar4;
  Disposer *pDVar5;
  
  if ((this->value).ptr.isSet == true) {
    pPVar1 = (this->value).ptr.field_1.value.ops.ptr;
    if (pPVar1 != (PipelineOp *)0x0) {
      sVar2 = (this->value).ptr.field_1.value.ops.size_;
      (this->value).ptr.field_1.value.ops.ptr = (PipelineOp *)0x0;
      (this->value).ptr.field_1.value.ops.size_ = 0;
      pAVar3 = (this->value).ptr.field_1.value.ops.disposer;
      (*(code *)**(undefined8 **)pAVar3)(pAVar3,pPVar1,8,sVar2,sVar2,0);
    }
    pPVar4 = (this->value).ptr.field_1.value.hook.ptr;
    if (pPVar4 != (PipelineHook *)0x0) {
      (this->value).ptr.field_1.value.hook.ptr = (PipelineHook *)0x0;
      pDVar5 = (this->value).ptr.field_1.value.hook.disposer;
      (**pDVar5->_vptr_Disposer)
                (pDVar5,pPVar4->_vptr_PipelineHook[-2] + (long)&pPVar4->_vptr_PipelineHook);
    }
  }
  if ((this->super_ExceptionOrValue).exception.ptr.isSet == true) {
    Exception::~Exception(&(this->super_ExceptionOrValue).exception.ptr.field_1.value);
    return;
  }
  return;
}

Assistant:

ExceptionOr() = default;